

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot_i.hpp
# Opt level: O2

bool __thiscall Gnuplot::file_available(Gnuplot *this,string *filename)

{
  bool bVar1;
  ostream *poVar2;
  GnuplotException *this_00;
  Gnuplot *this_01;
  ostringstream except;
  string local_40;
  
  this_01 = (Gnuplot *)&stack0xfffffffffffffe48;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
  bVar1 = file_exists(this_01,filename,0);
  if (bVar1) {
    file_exists(this_01,filename,4);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffe48);
    return false;
  }
  poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffe48,"File \"");
  poVar2 = std::operator<<(poVar2,(string *)filename);
  std::operator<<(poVar2,"\" does not exist");
  this_00 = (GnuplotException *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  GnuplotException::GnuplotException(this_00,&local_40);
  __cxa_throw(this_00,&GnuplotException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool Gnuplot::file_available(const std::string &filename) {
  std::ostringstream except;
  if (Gnuplot::file_exists(filename, 0)) {   // check existence
    if (!(Gnuplot::file_exists(filename, 4))) {   // check read permission
// except << "No read permission for File \"" << filename << "\"";
// throw GnuplotException(except.str());
// return false;
    }
  } else {
    except << "File \"" << filename << "\" does not exist";
    throw GnuplotException(except.str());
    return false;
  }
  return false;
}